

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O3

_Bool Curl_auth_digest_get_pair(char *str,char *value,char *content,char **endptr)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  long lVar7;
  byte bVar8;
  bool bVar9;
  char *pcVar6;
  
  lVar7 = 0;
  lVar4 = 0;
  while( true ) {
    cVar1 = str[lVar7];
    if (((cVar1 == '\0') || (cVar1 == '=')) || ((int)lVar7 == 0xff)) break;
    value[lVar7] = cVar1;
    lVar4 = lVar4 + -1;
    lVar7 = lVar7 + 1;
  }
  value[lVar7] = '\0';
  if (str[lVar7] != '=') {
    return false;
  }
  cVar1 = str[lVar7 + 1];
  pcVar6 = str + 2;
  if (cVar1 != '\"') {
    pcVar6 = str + 1;
  }
  pbVar5 = (byte *)(pcVar6 + -lVar4);
  bVar8 = *pbVar5;
  if (bVar8 != 0) {
    iVar3 = 0x3ff;
    bVar2 = false;
    do {
      bVar9 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar9) break;
      if (bVar2) {
LAB_005c15f9:
        *content = bVar8;
        content = (char *)((byte *)content + 1);
        bVar2 = false;
      }
      else if (bVar8 < 0x22) {
        if ((bVar8 != 10) && (bVar8 != 0xd)) goto LAB_005c15f9;
        iVar3 = 0;
        if (cVar1 == '\"') {
          return false;
        }
      }
      else if (bVar8 == 0x22) {
        iVar3 = 0;
        if (cVar1 != '\"') {
          return false;
        }
      }
      else if (bVar8 == 0x2c) {
        if (cVar1 == '\"') goto LAB_005c15f9;
        iVar3 = 0;
      }
      else if ((bVar8 != 0x5c) || (bVar2 = true, cVar1 != '\"')) goto LAB_005c15f9;
      bVar8 = pbVar5[1];
      pbVar5 = pbVar5 + 1;
    } while (bVar8 != 0);
    if (bVar2) {
      return false;
    }
  }
  *content = 0;
  *endptr = (char *)pbVar5;
  return true;
}

Assistant:

bool Curl_auth_digest_get_pair(const char *str, char *value, char *content,
                               const char **endptr)
{
  int c;
  bool starts_with_quote = FALSE;
  bool escape = FALSE;

  for(c = DIGEST_MAX_VALUE_LENGTH - 1; (*str && (*str != '=') && c--);)
    *value++ = *str++;
  *value = 0;

  if('=' != *str++)
    /* eek, no match */
    return FALSE;

  if('\"' == *str) {
    /* This starts with a quote so it must end with one as well! */
    str++;
    starts_with_quote = TRUE;
  }

  for(c = DIGEST_MAX_CONTENT_LENGTH - 1; *str && c--; str++) {
    if(!escape) {
      switch(*str) {
      case '\\':
        if(starts_with_quote) {
          /* the start of an escaped quote */
          escape = TRUE;
          continue;
        }
        break;

      case ',':
        if(!starts_with_quote) {
          /* This signals the end of the content if we didn't get a starting
             quote and then we do "sloppy" parsing */
          c = 0; /* the end */
          continue;
        }
        break;

      case '\r':
      case '\n':
        /* end of string */
        if(starts_with_quote)
          return FALSE; /* No closing quote */
        c = 0;
        continue;

      case '\"':
        if(starts_with_quote) {
          /* end of string */
          c = 0;
          continue;
        }
        else
          return FALSE;
      }
    }

    escape = FALSE;
    *content++ = *str;
  }
  if(escape)
    return FALSE; /* No character after backslash */

  *content = 0;
  *endptr = str;

  return TRUE;
}